

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Message *message;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe78;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe80;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  AssertHelper *rhs_expression;
  char *in_stack_fffffffffffffe98;
  int iVar2;
  AssertHelper *lhs_expression;
  char *in_stack_fffffffffffffea0;
  Type type;
  AssertionResult local_128 [2];
  Message *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar3;
  AssertionResult local_f8 [2];
  key_type local_d8;
  size_type local_d0;
  AssertionResult local_c8 [6];
  value_type local_60;
  value_type *in_stack_ffffffffffffffb8;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  key_type local_18;
  size_type local_10;
  
  type = (Type)((ulong)(in_RDI + 2) >> 0x20);
  local_18 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  local_10 = google::
             BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(uint *)in_stack_fffffffffffffe88,
             (unsigned_long *)in_stack_fffffffffffffe80);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc9b6bc);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffea0,iVar2,in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0xc9b719);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9b78a);
  rhs_expression = in_RDI + 2;
  local_60 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffe78,0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  lhs_expression = in_RDI + 2;
  local_d8 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  local_d0 = google::
             BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,
             (unsigned_long *)in_stack_fffffffffffffe88,(unsigned_long *)in_stack_fffffffffffffe80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffe88 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc9b875);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffea0,(int)((ulong)lhs_expression >> 0x20),
               (char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0xc9b8d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9b940);
  uVar3 = 1;
  message = (Message *)
            google::
            BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,(uint *)in_stack_fffffffffffffe88,
             (unsigned_long *)in_stack_fffffffffffffe80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffe80 =
         (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc9b9d7);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffea0,(int)((ulong)lhs_expression >> 0x20),
               (char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff00),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0xc9ba25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9ba8d);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)rhs_expression,(uint *)in_stack_fffffffffffffe88,
             (unsigned_long *)in_stack_fffffffffffffe80);
  iVar2 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    testing::AssertionResult::failure_message((AssertionResult *)0xc9bb13);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,in_stack_fffffffffffffea0,iVar2,(char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff00),message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0xc9bb5f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9bbc1);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}